

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

UBool __thiscall icu_63::SimpleTimeZone::operator==(SimpleTimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  bool local_29;
  bool local_19;
  TimeZone *that_local;
  SimpleTimeZone *this_local;
  
  local_19 = true;
  if (this != (SimpleTimeZone *)that) {
    if (this == (SimpleTimeZone *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)
                       (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    local_29 = false;
    if (bVar1) {
      UVar2 = TimeZone::operator==((TimeZone *)this,that);
      local_29 = false;
      if (UVar2 != '\0') {
        iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xb])
                          (this,that);
        local_29 = (char)iVar3 != '\0';
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

UBool
SimpleTimeZone::operator==(const TimeZone& that) const
{
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            TimeZone::operator==(that) &&
            hasSameRules(that)));
}